

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<InplaceStr,_8U>::SmallArray(SmallArray<InplaceStr,_8U> *this,Allocator *allocator)

{
  InplaceStr *local_20;
  Allocator *allocator_local;
  SmallArray<InplaceStr,_8U> *this_local;
  
  local_20 = this->little;
  do {
    InplaceStr::InplaceStr(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (InplaceStr *)&this->allocator);
  this->allocator = allocator;
  this->data = this->little;
  this->max = 8;
  this->count = 0;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}